

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_history.cpp
# Opt level: O1

void __thiscall
NshHistoryGetEntry_SuccessWhenOverriding_Test::TestBody
          (NshHistoryGetEntry_SuccessWhenOverriding_Test *this)

{
  int iVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  nsh_status_t status;
  char new_entry [10];
  char entry_override [10];
  char entry [128];
  nsh_history_t hist;
  Message local_8f0;
  AssertHelper local_8e8;
  internal local_8e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8d8;
  nsh_status_t local_8cc;
  char local_8c8 [16];
  char local_8b8 [16];
  char local_8a8 [132];
  nsh_history_t local_824;
  
  nsh_history_reset(&local_824);
  builtin_strncpy(local_8c8,"new_entry",10);
  iVar1 = 0x10;
  do {
    nsh_history_add_entry(&local_824,local_8c8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  builtin_strncpy(local_8b8,"overriden",10);
  nsh_history_add_entry(&local_824,local_8b8);
  local_8a8[0x70] = '\0';
  local_8a8[0x71] = '\0';
  local_8a8[0x72] = '\0';
  local_8a8[0x73] = '\0';
  local_8a8[0x74] = '\0';
  local_8a8[0x75] = '\0';
  local_8a8[0x76] = '\0';
  local_8a8[0x77] = '\0';
  local_8a8[0x78] = '\0';
  local_8a8[0x79] = '\0';
  local_8a8[0x7a] = '\0';
  local_8a8[0x7b] = '\0';
  local_8a8[0x7c] = '\0';
  local_8a8[0x7d] = '\0';
  local_8a8[0x7e] = '\0';
  local_8a8[0x7f] = '\0';
  local_8a8[0x60] = '\0';
  local_8a8[0x61] = '\0';
  local_8a8[0x62] = '\0';
  local_8a8[99] = '\0';
  local_8a8[100] = '\0';
  local_8a8[0x65] = '\0';
  local_8a8[0x66] = '\0';
  local_8a8[0x67] = '\0';
  local_8a8[0x68] = '\0';
  local_8a8[0x69] = '\0';
  local_8a8[0x6a] = '\0';
  local_8a8[0x6b] = '\0';
  local_8a8[0x6c] = '\0';
  local_8a8[0x6d] = '\0';
  local_8a8[0x6e] = '\0';
  local_8a8[0x6f] = '\0';
  local_8a8[0x50] = '\0';
  local_8a8[0x51] = '\0';
  local_8a8[0x52] = '\0';
  local_8a8[0x53] = '\0';
  local_8a8[0x54] = '\0';
  local_8a8[0x55] = '\0';
  local_8a8[0x56] = '\0';
  local_8a8[0x57] = '\0';
  local_8a8[0x58] = '\0';
  local_8a8[0x59] = '\0';
  local_8a8[0x5a] = '\0';
  local_8a8[0x5b] = '\0';
  local_8a8[0x5c] = '\0';
  local_8a8[0x5d] = '\0';
  local_8a8[0x5e] = '\0';
  local_8a8[0x5f] = '\0';
  local_8a8[0x40] = '\0';
  local_8a8[0x41] = '\0';
  local_8a8[0x42] = '\0';
  local_8a8[0x43] = '\0';
  local_8a8[0x44] = '\0';
  local_8a8[0x45] = '\0';
  local_8a8[0x46] = '\0';
  local_8a8[0x47] = '\0';
  local_8a8[0x48] = '\0';
  local_8a8[0x49] = '\0';
  local_8a8[0x4a] = '\0';
  local_8a8[0x4b] = '\0';
  local_8a8[0x4c] = '\0';
  local_8a8[0x4d] = '\0';
  local_8a8[0x4e] = '\0';
  local_8a8[0x4f] = '\0';
  local_8a8[0x30] = '\0';
  local_8a8[0x31] = '\0';
  local_8a8[0x32] = '\0';
  local_8a8[0x33] = '\0';
  local_8a8[0x34] = '\0';
  local_8a8[0x35] = '\0';
  local_8a8[0x36] = '\0';
  local_8a8[0x37] = '\0';
  local_8a8[0x38] = '\0';
  local_8a8[0x39] = '\0';
  local_8a8[0x3a] = '\0';
  local_8a8[0x3b] = '\0';
  local_8a8[0x3c] = '\0';
  local_8a8[0x3d] = '\0';
  local_8a8[0x3e] = '\0';
  local_8a8[0x3f] = '\0';
  local_8a8[0x20] = '\0';
  local_8a8[0x21] = '\0';
  local_8a8[0x22] = '\0';
  local_8a8[0x23] = '\0';
  local_8a8[0x24] = '\0';
  local_8a8[0x25] = '\0';
  local_8a8[0x26] = '\0';
  local_8a8[0x27] = '\0';
  local_8a8[0x28] = '\0';
  local_8a8[0x29] = '\0';
  local_8a8[0x2a] = '\0';
  local_8a8[0x2b] = '\0';
  local_8a8[0x2c] = '\0';
  local_8a8[0x2d] = '\0';
  local_8a8[0x2e] = '\0';
  local_8a8[0x2f] = '\0';
  local_8a8[0x10] = '\0';
  local_8a8[0x11] = '\0';
  local_8a8[0x12] = '\0';
  local_8a8[0x13] = '\0';
  local_8a8[0x14] = '\0';
  local_8a8[0x15] = '\0';
  local_8a8[0x16] = '\0';
  local_8a8[0x17] = '\0';
  local_8a8[0x18] = '\0';
  local_8a8[0x19] = '\0';
  local_8a8[0x1a] = '\0';
  local_8a8[0x1b] = '\0';
  local_8a8[0x1c] = '\0';
  local_8a8[0x1d] = '\0';
  local_8a8[0x1e] = '\0';
  local_8a8[0x1f] = '\0';
  local_8a8[0] = '\0';
  local_8a8[1] = '\0';
  local_8a8[2] = '\0';
  local_8a8[3] = '\0';
  local_8a8[4] = '\0';
  local_8a8[5] = '\0';
  local_8a8[6] = '\0';
  local_8a8[7] = '\0';
  local_8a8[8] = '\0';
  local_8a8[9] = '\0';
  local_8a8[10] = '\0';
  local_8a8[0xb] = '\0';
  local_8a8[0xc] = '\0';
  local_8a8[0xd] = '\0';
  local_8a8[0xe] = '\0';
  local_8a8[0xf] = '\0';
  local_8cc = nsh_history_get_entry(&local_824,1,local_8a8);
  local_8f0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<nsh_status,nsh_status>
            (local_8e0,"status","NSH_STATUS_OK",&local_8cc,(nsh_status *)&local_8f0);
  if (local_8e0[0] == (internal)0x0) {
    testing::Message::Message(&local_8f0);
    if (local_8d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_8d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_8e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8e8,&local_8f0);
  }
  else {
    if (local_8d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_8d8,local_8d8);
    }
    testing::internal::CmpHelperSTREQ(local_8e0,"entry","new_entry",local_8a8,local_8c8);
    if (local_8e0[0] != (internal)0x0) goto LAB_0011c481;
    testing::Message::Message(&local_8f0);
    if (local_8d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_8d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_8e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
               ,0x9f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8e8,&local_8f0);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_8e8);
  if ((long *)CONCAT44(local_8f0.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_8f0.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_8f0.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_8f0.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
  }
LAB_0011c481:
  if (local_8d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_8d8,local_8d8);
  }
  return;
}

Assistant:

TEST(NshHistoryGetEntry, SuccessWhenOverriding)
{
    nsh_history_t hist;
    nsh_history_reset(&hist);

    const char new_entry[] = "new_entry";
    for (unsigned int i = 0; i < NSH_CMD_HISTORY_SIZE; i++) {
        nsh_history_add_entry(&hist, new_entry);
    }

    const char entry_override[] = "overriden";
    nsh_history_add_entry(&hist, entry_override);

    char entry[NSH_LINE_BUFFER_SIZE] = {};
    auto status = nsh_history_get_entry(&hist, 1, entry);

    ASSERT_EQ(status, NSH_STATUS_OK);
    ASSERT_STREQ(entry, new_entry);
}